

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.cc
# Opt level: O1

mat3f * __thiscall hmi::renderer::get_view_matrix(mat3f *__return_storage_ptr__,renderer *this)

{
  float *pfVar1;
  size_t i;
  long lVar2;
  float *pfVar3;
  size_t j;
  long lVar4;
  float *pfVar5;
  size_t k;
  long lVar6;
  common_type_t<float,_float> value;
  float fVar7;
  float local_48 [3];
  undefined8 local_3c;
  float local_34;
  undefined8 local_30;
  undefined4 local_28;
  float local_24 [5];
  undefined8 local_10;
  undefined8 uStack_8;
  
  pfVar1 = local_24;
  local_24[0] = 2.0 / (this->m_view_size).field_0.data[0];
  lVar2 = 0;
  local_24[1] = 0.0;
  local_24[2] = 0.0;
  local_24[3] = 0.0;
  local_24[4] = -2.0 / (this->m_view_size).field_0.data[1];
  local_10 = 0;
  uStack_8 = 0x3f80000000000000;
  local_48[0] = 1.0;
  local_48[1] = 0.0;
  local_48[2] = -(this->m_view_center).field_0.data[0];
  local_3c = 0x3f80000000000000;
  local_34 = -(this->m_view_center).field_0.data[1];
  local_30 = 0;
  local_28 = 0x3f800000;
  do {
    lVar4 = 0;
    pfVar3 = local_48;
    do {
      fVar7 = 0.0;
      lVar6 = 0;
      pfVar5 = pfVar3;
      do {
        fVar7 = fVar7 + pfVar1[lVar6] * *pfVar5;
        lVar6 = lVar6 + 1;
        pfVar5 = pfVar5 + 3;
      } while (lVar6 != 3);
      *(float *)((long)&__return_storage_ptr__->field_0 + lVar4 * 4 + lVar2 * 0xc) = fVar7;
      lVar4 = lVar4 + 1;
      pfVar3 = pfVar3 + 1;
    } while (lVar4 != 3);
    lVar2 = lVar2 + 1;
    pfVar1 = pfVar1 + 3;
  } while (lVar2 != 3);
  return __return_storage_ptr__;
}

Assistant:

mat3f renderer::get_view_matrix() const {
    mat3f scaling(
      2.0f / m_view_size.x, 0.0f,                   0.0f,
      0.0f,                 - 2.0f / m_view_size.y, 0.0f,
      0.0f,                 0.0f,                   1.0f
    );

    mat3f translation(
      1.0f, 0.0f, - m_view_center.x,
      0.0f, 1.0f, - m_view_center.y,
      0.0f, 0.0f, 1.0f
    );

    return scaling * translation;
  }